

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ConfigureXmlOutput(UnitTestImpl *this)

{
  bool bVar1;
  XmlUnitTestResultPrinter *this_00;
  TestEventListeners *pTVar2;
  JsonUnitTestResultPrinter *this_01;
  char *pcVar3;
  ulong uVar4;
  ostream *poVar5;
  GTestLog local_98;
  undefined1 local_91;
  string local_90 [39];
  undefined1 local_69;
  string local_68 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *output_format;
  UnitTestImpl *this_local;
  
  output_format = (string *)this;
  UnitTestOptions::GetOutputFormat_abi_cxx11_();
  local_18 = &local_38;
  bVar1 = std::operator==(&local_38,"xml");
  if (bVar1) {
    pTVar2 = listeners(this);
    this_00 = (XmlUnitTestResultPrinter *)operator_new(0x28);
    local_69 = 1;
    UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(this_00,pcVar3);
    local_69 = 0;
    TestEventListeners::SetDefaultXmlGenerator(pTVar2,(TestEventListener *)this_00);
    std::__cxx11::string::~string(local_68);
  }
  else {
    bVar1 = std::operator==(local_18,"json");
    if (bVar1) {
      pTVar2 = listeners(this);
      this_01 = (JsonUnitTestResultPrinter *)operator_new(0x28);
      local_91 = 1;
      UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      JsonUnitTestResultPrinter::JsonUnitTestResultPrinter(this_01,pcVar3);
      local_91 = 0;
      TestEventListeners::SetDefaultXmlGenerator(pTVar2,(TestEventListener *)this_01);
      std::__cxx11::string::~string(local_90);
    }
    else {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        GTestLog::GTestLog(&local_98,GTEST_WARNING,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/src/gtest.cc"
                           ,0x166f);
        poVar5 = GTestLog::GetStream(&local_98);
        poVar5 = std::operator<<(poVar5,"WARNING: unrecognized output format \"");
        poVar5 = std::operator<<(poVar5,(string *)local_18);
        std::operator<<(poVar5,"\" ignored.");
        GTestLog::~GTestLog(&local_98);
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void UnitTestImpl::ConfigureXmlOutput() {
  const std::string& output_format = UnitTestOptions::GetOutputFormat();
#if GTEST_HAS_FILE_SYSTEM
  if (output_format == "xml") {
    listeners()->SetDefaultXmlGenerator(new XmlUnitTestResultPrinter(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str()));
  } else if (output_format == "json") {
    listeners()->SetDefaultXmlGenerator(new JsonUnitTestResultPrinter(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str()));
  } else if (!output_format.empty()) {
    GTEST_LOG_(WARNING) << "WARNING: unrecognized output format \""
                        << output_format << "\" ignored.";
  }
#else
  if (!output_format.empty()) {
    GTEST_LOG_(ERROR) << "ERROR: alternative output formats require "
                      << "GTEST_HAS_FILE_SYSTEM to be enabled";
  }
#endif  // GTEST_HAS_FILE_SYSTEM
}